

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::create_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  int *piVar3;
  char cVar4;
  int iVar5;
  int k;
  _func_int *p_Var6;
  ulong uVar7;
  Allocator *pAVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int _w;
  ulong uVar12;
  Mat local_c0;
  Mat local_78;
  
  p_Var6 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  uVar12 = (long)*(int *)(&this->field_0xd8 + (long)p_Var6) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var6);
  uVar1 = *(uint *)(&this->field_0x114 + (long)p_Var6);
  uVar10 = (long)*(int *)(&this->field_0x110 + (long)p_Var6) / (long)(int)uVar1;
  _w = (int)uVar12;
  uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)_w;
  if ((uVar1 != *(uint *)(&this->field_0xd0 + (long)p_Var6)) ||
     ((int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var6) / (int)uVar1)) * uVar1 != uVar1))
  {
    create_group_ops(this,opt);
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var6 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
    piVar3 = *(int **)(&this->field_0x170 + (long)p_Var6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x188 + (long)p_Var6) == (long *)0x0) {
          free(*(void **)(&this->field_0x168 + (long)p_Var6));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var6) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var6) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var6) = 0;
    *(undefined4 *)(&this->field_0x1a0 + (long)p_Var6) = 0;
    return 0;
  }
  if (opt->use_packing_layout == true) {
    if ((uVar1 & 0xf) == 0) {
      cVar4 = '\x10';
    }
    else if ((uVar1 & 7) == 0) {
      cVar4 = '\b';
    }
    else {
      cVar4 = ((uVar1 & 3) == 0) * '\x03' + '\x01';
    }
  }
  else {
    cVar4 = '\x01';
  }
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  iVar11 = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,*(int *)(&this->field_0x194 + (long)p_Var6),4,(Allocator *)0x0);
  pp_Var2 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
  p_Var6 = pp_Var2[-3];
  lVar9 = *(long *)(&this->field_0x168 + (long)p_Var6);
  uVar10 = 0;
  if (0 < _w) {
    uVar10 = uVar12 & 0xffffffff;
  }
  pAVar8 = (Allocator *)local_78.data;
  for (; iVar5 = *(int *)(&this->field_0x114 + (long)p_Var6),
      iVar11 < (int)((uVar1 - (int)uVar1 % iVar5) *
                    (*(int *)(&this->field_0xd0 + (long)p_Var6) / iVar5)); iVar11 = iVar11 + 1) {
    iVar5 = _w;
    for (uVar7 = 0; iVar5 = iVar5 + -1, uVar10 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined4 *)((long)&pAVar8->_vptr_Allocator + (long)iVar5 * 4) =
           *(undefined4 *)(lVar9 + uVar7 * 4);
    }
    pAVar8 = (Allocator *)((long)&pAVar8->_vptr_Allocator + uVar12 * 4);
    p_Var6 = pp_Var2[-3];
    lVar9 = lVar9 + uVar12 * 4;
  }
  if (cVar4 == '\x01') {
    if (&this->weight_data_tm != &local_78) {
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pAVar8 = (this->weight_data_tm).allocator;
          if (pAVar8 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar8->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = local_78.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
      (this->weight_data_tm).elemsize = local_78.elemsize;
      (this->weight_data_tm).elempack = local_78.elempack;
      (this->weight_data_tm).allocator = local_78.allocator;
      (this->weight_data_tm).dims = local_78.dims;
      (this->weight_data_tm).w = local_78.w;
      (this->weight_data_tm).h = local_78.h;
      (this->weight_data_tm).d = local_78.d;
      (this->weight_data_tm).c = local_78.c;
      (this->weight_data_tm).cstep = local_78.cstep;
    }
    goto LAB_0042ed11;
  }
  if (cVar4 == '\x04') {
    Mat::reshape(&local_c0,&local_78,_w,iVar5,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,4,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042ed11;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042ed11;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042ed11;
    }
  }
  else if (cVar4 == '\b') {
    Mat::reshape(&local_c0,&local_78,_w,iVar5,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,8,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042ed11;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042ed11;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042ed11;
    }
  }
  else {
    if (cVar4 != '\x10') goto LAB_0042ed11;
    Mat::reshape(&local_c0,&local_78,_w,iVar5,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,0x10,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042ed11;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042ed11;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042ed11;
    }
  }
  free(local_c0.data);
LAB_0042ed11:
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}